

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaNtk.c
# Opt level: O0

int Cba_StrCmpInt(char *p1,char *p2,int i)

{
  int iVar1;
  int iVar2;
  int Num2;
  int Num1;
  int i_local;
  char *p2_local;
  char *p1_local;
  
  iVar1 = Cba_CharIsDigit(p1[i]);
  if (((iVar1 == 0) && (iVar1 = Cba_CharIsDigit(p2[i]), iVar1 == 0)) ||
     (((i < 1 || (iVar1 = Cba_CharIsDigit(p1[i + -1]), iVar1 == 0)) &&
      ((iVar1 = Cba_CharIsDigit(p1[i]), iVar1 == 0 || (iVar1 = Cba_CharIsDigit(p2[i]), iVar1 == 0)))
      ))) {
    if (p1[i] < p2[i]) {
      p1_local._4_4_ = -1;
    }
    else {
      if (p1[i] <= p2[i]) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/cba/cbaNtk.c"
                      ,0x19f,"int Cba_StrCmpInt(char *, char *, int)");
      }
      p1_local._4_4_ = 1;
    }
  }
  else {
    Num2 = i + -1;
    while ((-1 < Num2 && (iVar1 = Cba_CharIsDigit(p1[Num2]), iVar1 != 0))) {
      Num2 = Num2 + -1;
    }
    iVar1 = Num2 + 1;
    iVar2 = Cba_CharIsDigit(p1[iVar1]);
    if (iVar2 == 0) {
      __assert_fail("Cba_CharIsDigit(p1[i])",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/cba/cbaNtk.c"
                    ,0x18a,"int Cba_StrCmpInt(char *, char *, int)");
    }
    iVar2 = Cba_CharIsDigit(p2[iVar1]);
    if (iVar2 == 0) {
      __assert_fail("Cba_CharIsDigit(p2[i])",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/cba/cbaNtk.c"
                    ,0x18b,"int Cba_StrCmpInt(char *, char *, int)");
    }
    if ((iVar1 != 0) && (iVar2 = Cba_CharIsDigit(p1[Num2]), iVar2 != 0)) {
      __assert_fail("i == 0 || !Cba_CharIsDigit(p1[i-1])",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/cba/cbaNtk.c"
                    ,0x18d,"int Cba_StrCmpInt(char *, char *, int)");
    }
    if ((iVar1 != 0) && (iVar2 = Cba_CharIsDigit(p2[Num2]), iVar2 != 0)) {
      __assert_fail("i == 0 || !Cba_CharIsDigit(p2[i-1])",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/cba/cbaNtk.c"
                    ,0x18e,"int Cba_StrCmpInt(char *, char *, int)");
    }
    iVar2 = atoi(p1 + iVar1);
    iVar1 = atoi(p2 + iVar1);
    if (iVar2 < iVar1) {
      p1_local._4_4_ = -1;
    }
    else {
      if (iVar2 <= iVar1) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/cba/cbaNtk.c"
                      ,0x196,"int Cba_StrCmpInt(char *, char *, int)");
      }
      p1_local._4_4_ = 1;
    }
  }
  return p1_local._4_4_;
}

Assistant:

int Cba_StrCmpInt( char * p1, char * p2, int i )
{
    // check if one of the mismatching chars is a digit
    if ( Cba_CharIsDigit(p1[i]) || Cba_CharIsDigit(p2[i]) )
    {
        // if previous (equal) char was a digit or if this is first digit on both sides, scroll back
        if ( (i > 0 && Cba_CharIsDigit(p1[i-1])) || (Cba_CharIsDigit(p1[i]) && Cba_CharIsDigit(p2[i])) )
        {
            int Num1, Num2;
            // find the first digit
            for ( --i; i >= 0; i-- )
                if ( !Cba_CharIsDigit(p1[i]) )
                    break;
            i++;
            // current char is digit
            assert( Cba_CharIsDigit(p1[i]) );
            assert( Cba_CharIsDigit(p2[i]) );
            // previous char does not exist or is not a digit
            assert( i == 0 || !Cba_CharIsDigit(p1[i-1]) );
            assert( i == 0 || !Cba_CharIsDigit(p2[i-1]) );
            // compare numbers
            Num1 = atoi( p1 + i );
            Num2 = atoi( p2 + i );
            if ( Num1 < Num2 )
                return -1;
            if ( Num1 > Num2 ) 
                return 1;
            assert( 0 );
            return 0;
        }
    }
    // compare as usual
    if ( p1[i] < p2[i] )
        return -1;
    if ( p1[i] > p2[i] )
        return 1;
    assert( 0 );
    return 0;
}